

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint uVar1;
  Random *this_00;
  TypeBuilder *pTVar2;
  bool bVar3;
  uint32_t uVar4;
  BasicType BVar5;
  BasicHeapType BVar6;
  int iVar7;
  FeatureOptions<wasm::Type::BasicType> *pFVar8;
  HeapType HVar9;
  value_type_conflict3 *pvVar10;
  Type TVar11;
  Exactness EVar12;
  Entry local_78;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> eligible;
  value_type_conflict3 local_34 [2];
  Index i;
  
  uVar4 = Random::upTo(this->rand,2);
  if (uVar4 == 1) {
    bVar3 = Random::oneIn(this->rand,4);
    if (bVar3) {
      BVar6 = generateBasicHeapType(this,share);
      HVar9.id = (uintptr_t)BVar6;
    }
    else if (share == Shared) {
      eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_34[0] = 0;
      auStack_68 = (undefined1  [8])0x0;
      eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar1 = (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[this->index];
      for (; local_34[0] < uVar1; local_34[0] = local_34[0] + 1) {
        local_78.builder = this->builder;
        local_78.index = (size_t)local_34[0];
        TypeBuilder::Entry::operator_cast_to_HeapType(&local_78);
        iVar7 = wasm::HeapType::getShared();
        if (iVar7 == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,local_34);
        }
      }
      if (auStack_68 ==
          (undefined1  [8])
          eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        BVar6 = generateBasicHeapType(this,Shared);
        HVar9.id = (uintptr_t)BVar6;
      }
      else {
        pTVar2 = this->builder;
        pvVar10 = Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (this->rand,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
        local_78.index = (size_t)*pvVar10;
        local_78.builder = pTVar2;
        HVar9 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_78);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
    }
    else {
      pTVar2 = this->builder;
      uVar4 = Random::upTo(this->rand,
                           (this->recGroupEnds).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[this->index]);
      eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)uVar4;
      auStack_68 = (undefined1  [8])pTVar2;
      HVar9 = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_68);
    }
    auStack_68 = (undefined1  [8])HVar9.id;
    bVar3 = HeapType::isMaybeShared((HeapType *)auStack_68,exn);
    if (bVar3) {
      EVar12 = Exact;
    }
    else {
      bVar3 = Random::oneIn(this->rand,2);
      EVar12 = (Exactness)bVar3;
    }
    TVar11.id = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,auStack_68._0_4_,EVar12);
  }
  else {
    if (uVar4 != 0) {
      wasm::handle_unreachable
                ("unexpected",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0xe8);
    }
    this_00 = this->rand;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&eligible;
    auStack_68 = (undefined1  [8])0x0;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    eligible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pFVar8 = Random::FeatureOptions<wasm::Type::BasicType>::
             add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                       ((FeatureOptions<wasm::Type::BasicType> *)auStack_68,(FeatureSet)0x0,i32,i64,
                        f32,f64);
    pFVar8 = Random::FeatureOptions<wasm::Type::BasicType>::add<>(pFVar8,(FeatureSet)0x8,v128);
    BVar5 = Random::pick<wasm::Type::BasicType>(this_00,pFVar8);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
                 *)auStack_68);
    TVar11.id = (uintptr_t)BVar5;
  }
  return (Type)TVar11.id;
}

Assistant:

Type generateSingleType(Shareability share) {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType(share);
    }
    WASM_UNREACHABLE("unexpected");
  }